

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O3

bool tcu::anon_unknown_3::compareColors
               (RGBA *colorA,RGBA *colorB,int redBits,int greenBits,int blueBits)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ((uint)colorA & 0xff) - ((uint)colorB & 0xff);
  iVar2 = -iVar1;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  if (iVar2 <= 1 << (8U - (char)redBits & 0x1f)) {
    iVar1 = ((uint)((ulong)colorA >> 8) & 0xff) - ((uint)((ulong)colorB >> 8) & 0xff);
    iVar2 = -iVar1;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    if (iVar2 <= 1 << (8U - (char)greenBits & 0x1f)) {
      iVar1 = ((uint)colorA >> 0x10 & 0xff) - ((uint)colorB >> 0x10 & 0xff);
      iVar2 = -iVar1;
      if (0 < iVar1) {
        iVar2 = iVar1;
      }
      return iVar2 <= 1 << (8U - (char)blueBits & 0x1f);
    }
  }
  return false;
}

Assistant:

bool compareColors (const tcu::RGBA& colorA, const tcu::RGBA& colorB, int redBits, int greenBits, int blueBits)
{
	const int thresholdRed		= 1 << (8 - redBits);
	const int thresholdGreen	= 1 << (8 - greenBits);
	const int thresholdBlue		= 1 << (8 - blueBits);

	return	deAbs32(colorA.getRed()   - colorB.getRed())   <= thresholdRed   &&
			deAbs32(colorA.getGreen() - colorB.getGreen()) <= thresholdGreen &&
			deAbs32(colorA.getBlue()  - colorB.getBlue())  <= thresholdBlue;
}